

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_condest.c
# Opt level: O1

double lu_normest(lu_int m,lu_int *Ubegin,lu_int *Ui,double *Ux,double *pivot,lu_int *perm,int upper
                 ,double *work)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  lu_int lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  uVar1 = m - 1;
  uVar3 = 0;
  if (upper == 0) {
    uVar3 = uVar1;
  }
  uVar2 = -(uint)(upper == 0) | m;
  dVar8 = 0.0;
  dVar9 = 0.0;
  dVar10 = 0.0;
  if (uVar3 != uVar2) {
    lVar7 = (long)(int)uVar3;
    dVar10 = 0.0;
    do {
      if (perm == (lu_int *)0x0) {
        lVar6 = (lu_int)lVar7;
      }
      else {
        lVar6 = perm[lVar7];
      }
      uVar3 = Ui[Ubegin[lVar6]];
      if ((int)uVar3 < 0) {
        dVar11 = 0.0;
      }
      else {
        lVar5 = (long)Ubegin[lVar6] << 2;
        dVar11 = 0.0;
        do {
          dVar11 = dVar11 - work[uVar3] * *(double *)((long)Ux + lVar5 * 2);
          uVar3 = *(uint *)((long)Ui + lVar5 + 4);
          lVar5 = lVar5 + 4;
        } while (-1 < (int)uVar3);
      }
      dVar11 = dVar11 + *(double *)(&DAT_003c50a0 + (ulong)(0.0 <= dVar11) * 8);
      if (pivot != (double *)0x0) {
        dVar11 = dVar11 / pivot[lVar6];
      }
      work[lVar6] = dVar11;
      dVar11 = ABS(dVar11);
      dVar9 = dVar9 + dVar11;
      dVar12 = dVar11;
      if (dVar11 <= dVar10) {
        dVar12 = dVar10;
      }
      dVar10 = (double)(~-(ulong)NAN(dVar10) & (ulong)dVar12 | -(ulong)NAN(dVar10) & (ulong)dVar11);
      lVar7 = lVar7 + (-(ulong)(upper == 0) | 1);
    } while (uVar2 != (uint)lVar7);
  }
  if (upper == 0) {
    uVar1 = 0;
  }
  uVar3 = -(uint)(upper != 0) | m;
  if (uVar1 != uVar3) {
    lVar7 = (long)(int)uVar1;
    dVar8 = 0.0;
    do {
      if (perm == (lu_int *)0x0) {
        iVar4 = (int)lVar7;
      }
      else {
        iVar4 = perm[lVar7];
      }
      if (pivot != (double *)0x0) {
        work[iVar4] = work[iVar4] / pivot[iVar4];
      }
      dVar11 = work[iVar4];
      uVar1 = Ui[Ubegin[iVar4]];
      if (-1 < (int)uVar1) {
        lVar5 = (long)Ubegin[iVar4] << 2;
        do {
          work[uVar1] = *(double *)((long)Ux + lVar5 * 2) * -dVar11 + work[uVar1];
          uVar1 = *(uint *)((long)Ui + lVar5 + 4);
          lVar5 = lVar5 + 4;
        } while (-1 < (int)uVar1);
      }
      dVar8 = dVar8 + ABS(dVar11);
      lVar7 = lVar7 + (-(ulong)(upper != 0) | 1);
    } while (uVar3 != (uint)lVar7);
  }
  dVar8 = dVar8 / dVar9;
  dVar9 = dVar10;
  if (dVar10 <= dVar8) {
    dVar9 = dVar8;
  }
  return (double)(-(ulong)NAN(dVar8) & (ulong)dVar10 | ~-(ulong)NAN(dVar8) & (ulong)dVar9);
}

Assistant:

double lu_normest(
    lu_int m, const lu_int *Ubegin, const lu_int *Ui, const double *Ux,
    const double *pivot, const lu_int *perm, int upper, double *work)
{
    lu_int i, j, k, kbeg, kend, kinc, p;
    double x1norm, xinfnorm, y1norm, temp;

    x1norm = 0;
    xinfnorm = 0;
    if (upper)
    {
        kbeg = 0; kend = m; kinc = 1;
    }
    else
    {
        kbeg = m-1; kend = -1; kinc = -1;
    }
    for (k = kbeg; k != kend; k += kinc)
    {
        j = perm ? perm[k] : k;
        temp = 0;
        for (p = Ubegin[j]; (i = Ui[p]) >= 0; p++)
            temp -= work[i] * Ux[p];
        temp += temp >= 0 ? 1 : -1; /* choose b[i] = 1 or b[i] = -1 */
        if (pivot) temp /= pivot[j];
        work[j] = temp;
        x1norm += fabs(temp);
        xinfnorm = fmax(xinfnorm, fabs(temp));
    }

    y1norm = 0;
    if (upper)
    {
        kbeg = m-1; kend = -1; kinc = -1;
    }
    else
    {
        kbeg = 0; kend = m; kinc = 1;
    }
    for (k = kbeg; k != kend; k += kinc)
    {
        j = perm ? perm[k] : k;
        if (pivot) work[j] /= pivot[j];
        temp = work[j];
        for (p = Ubegin[j]; (i = Ui[p]) >= 0; p++)
            work[i] -= temp * Ux[p];
        y1norm += fabs(temp);
    }

    return fmax(y1norm/x1norm, xinfnorm);
}